

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint uVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  uint *puVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  uint uVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  int *piVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int iVar17;
  long lVar18;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_258;
  int *local_218;
  uint local_20c;
  cpp_dec_float<50U,_int,_void> local_208;
  ulong local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  int *local_180;
  pointer local_178;
  int *local_170;
  int *local_168;
  int *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  int *local_150;
  int *local_148;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  int *local_138;
  long local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_208.fpclass = cpp_dec_float_finite;
  local_208.prec_elem = 10;
  local_208.data._M_elems[0] = 0;
  local_208.data._M_elems[1] = 0;
  local_208.data._M_elems[2] = 0;
  local_208.data._M_elems[3] = 0;
  local_208.data._M_elems[4] = 0;
  local_208.data._M_elems[5] = 0;
  local_208.data._M_elems._24_5_ = 0;
  local_208.data._M_elems[7]._1_3_ = 0;
  local_208.data._M_elems[8] = 0;
  local_208.data._M_elems[9] = 0;
  local_208.exp = 0;
  local_208.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  if (rn < 1) {
    local_1c8 = 0;
  }
  else {
    local_148 = (this->row).orig;
    local_138 = (this->row).perm;
    local_160 = (this->col).orig;
    local_170 = (this->u).col.idx;
    local_178 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_168 = (this->u).col.len;
    local_180 = (this->u).col.start;
    local_1c8 = 0;
    local_218 = ridx;
    local_1c0 = rhs;
    local_158 = vec;
    local_150 = vidx;
    local_140 = this;
    do {
      lVar18 = (long)*local_218;
      uVar13 = rn - 1;
      iVar11 = local_218[(long)rn + -1];
      iVar9 = 1;
      iVar10 = 0;
      if (3 < rn) {
        iVar10 = 0;
        do {
          iVar4 = local_218[iVar9];
          iVar17 = local_218[(long)iVar9 + 1];
          piVar15 = local_218 + iVar10;
          if (iVar17 < iVar4) {
            iVar10 = iVar9;
            iVar17 = iVar4;
            if (iVar4 <= iVar11) goto LAB_002abf18;
          }
          else {
            if (iVar17 <= iVar11) goto LAB_002abf18;
            iVar10 = iVar9 + 1;
          }
          *piVar15 = iVar17;
          iVar9 = iVar10 * 2 + 1;
        } while (iVar9 < (int)(rn - 2U));
      }
      if ((iVar9 < (int)uVar13) && (iVar11 < local_218[iVar9])) {
        local_218[iVar10] = local_218[iVar9];
        iVar10 = iVar9;
      }
      piVar15 = local_218 + iVar10;
LAB_002abf18:
      *piVar15 = iVar11;
      pcVar14 = &local_1c0[local_148[lVar18]].m_backend;
      pcVar12 = &(local_140->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_148[lVar18]].m_backend;
      local_258.fpclass = cpp_dec_float_finite;
      local_258.prec_elem = 10;
      local_258.data._M_elems[0] = 0;
      local_258.data._M_elems[1] = 0;
      local_258.data._M_elems[2] = 0;
      local_258.data._M_elems[3] = 0;
      local_258.data._M_elems[4] = 0;
      local_258.data._M_elems[5] = 0;
      local_258.data._M_elems._24_5_ = 0;
      local_258.data._M_elems[7]._1_3_ = 0;
      local_258.data._M_elems._32_5_ = 0;
      local_258.data._M_elems[9]._1_3_ = 0;
      local_258.exp = 0;
      local_258.neg = false;
      pcVar16 = pcVar12;
      if ((&local_258 != pcVar14) && (pcVar16 = pcVar14, &local_258 != pcVar12)) {
        uVar5 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
        local_258.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_258.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
        local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
        local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
        uVar5 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
        local_258.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_258.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_258.exp = pcVar12->exp;
        local_258.neg = pcVar12->neg;
        local_258.fpclass = pcVar12->fpclass;
        local_258.prec_elem = pcVar12->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_258,pcVar16)
      ;
      local_208.data._M_elems[0] = local_258.data._M_elems[0];
      local_208.data._M_elems[1] = local_258.data._M_elems[1];
      local_208.data._M_elems[2] = local_258.data._M_elems[2];
      local_208.data._M_elems[3] = local_258.data._M_elems[3];
      local_208.data._M_elems[4] = local_258.data._M_elems[4];
      local_208.data._M_elems[5] = local_258.data._M_elems[5];
      local_208.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
      local_208.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
      local_208.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
      local_208.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
      local_208.exp = local_258.exp;
      local_208.neg = local_258.neg;
      local_208.fpclass = local_258.fpclass;
      local_208.prec_elem = local_258.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar14,0);
      local_258.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
      local_258.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
      local_258.data._M_elems[4] = local_208.data._M_elems[4];
      local_258.data._M_elems[5] = local_208.data._M_elems[5];
      local_258.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
      local_258.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
      local_258.data._M_elems[2] = local_208.data._M_elems[2];
      local_258.data._M_elems[3] = local_208.data._M_elems[3];
      local_258.data._M_elems[0] = local_208.data._M_elems[0];
      local_258.data._M_elems[1] = local_208.data._M_elems[1];
      auVar8 = (undefined1  [16])local_258.data._M_elems._0_16_;
      local_68.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_68.exp = (eps->m_backend).exp;
      local_68.neg = (eps->m_backend).neg;
      local_68.fpclass = (eps->m_backend).fpclass;
      local_68.prec_elem = (eps->m_backend).prec_elem;
      local_258.exp = local_208.exp;
      local_258.neg = local_208.neg;
      local_258.fpclass = local_208.fpclass;
      local_258.prec_elem = local_208.prec_elem;
      if ((local_208.neg == true) &&
         (local_258.data._M_elems[0] = local_208.data._M_elems[0],
         local_258.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
        local_258.neg = false;
      }
      rn = uVar13;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
         (local_258.data._M_elems._0_16_ = auVar8,
         iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_258,&local_68), 0 < iVar9)) {
        iVar9 = local_160[lVar18];
        local_150[(int)local_1c8] = iVar9;
        *(undefined8 *)(local_158[iVar9].m_backend.data._M_elems + 8) =
             local_208.data._M_elems._32_8_;
        puVar3 = local_158[iVar9].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = local_208.data._M_elems._16_8_;
        *(ulong *)(puVar3 + 2) =
             CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
        *(undefined8 *)local_158[iVar9].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
        *(undefined8 *)(local_158[iVar9].m_backend.data._M_elems + 2) =
             local_208.data._M_elems._8_8_;
        local_158[iVar9].m_backend.exp = local_208.exp;
        local_158[iVar9].m_backend.neg = local_208.neg;
        local_158[iVar9].m_backend.fpclass = local_208.fpclass;
        local_158[iVar9].m_backend.prec_elem = local_208.prec_elem;
        local_20c = uVar13;
        local_130 = lVar18;
        if (0 < local_168[iVar9]) {
          piVar15 = local_170 + local_180[iVar9];
          pcVar14 = &local_178[local_180[iVar9]].m_backend;
          iVar9 = local_168[iVar9];
          do {
            iVar11 = *piVar15;
            pnVar2 = local_1c0 + iVar11;
            local_1b8.data._M_elems._32_8_ =
                 *(undefined8 *)(local_1c0[iVar11].m_backend.data._M_elems + 8);
            local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_1c0[iVar11].m_backend.data._M_elems
            ;
            local_1b8.data._M_elems._8_8_ =
                 *(undefined8 *)(local_1c0[iVar11].m_backend.data._M_elems + 2);
            puVar3 = local_1c0[iVar11].m_backend.data._M_elems + 4;
            local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            uVar5 = *(undefined8 *)(puVar3 + 2);
            local_1b8.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_1b8.exp = local_1c0[iVar11].m_backend.exp;
            local_1b8.neg = local_1c0[iVar11].m_backend.neg;
            local_1b8.fpclass = local_1c0[iVar11].m_backend.fpclass;
            local_1b8.prec_elem = local_1c0[iVar11].m_backend.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_002ac227:
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems._24_5_ = 0;
              local_258.data._M_elems[7]._1_3_ = 0;
              local_258.data._M_elems._32_5_ = 0;
              local_258.data._M_elems[9]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              pcVar16 = &local_208;
              if (&local_258 != pcVar14) {
                local_258.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_258.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_258.data._M_elems[4] = local_208.data._M_elems[4];
                local_258.data._M_elems[5] = local_208.data._M_elems[5];
                local_258.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_258.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_258.data._M_elems[0] = local_208.data._M_elems[0];
                local_258.data._M_elems[1] = local_208.data._M_elems[1];
                local_258.data._M_elems[2] = local_208.data._M_elems[2];
                local_258.data._M_elems[3] = local_208.data._M_elems[3];
                local_258.exp = local_208.exp;
                local_258.neg = local_208.neg;
                local_258.fpclass = local_208.fpclass;
                local_258.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar14;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_258,pcVar16);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1b8,&local_258);
              a = 0.0;
              if (local_1b8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_258,0,(type *)0x0);
                iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1b8,&local_258);
                a = 1e-100;
                if (iVar11 != 0) {
                  a = 0.0;
                }
              }
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 10;
              local_258.data._M_elems._0_16_ = ZEXT816(0);
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems._24_5_ = 0;
              local_258.data._M_elems[7]._1_3_ = 0;
              local_258.data._M_elems._32_5_ = 0;
              local_258.data._M_elems[9]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_258,a);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_1b8,&local_258);
              *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8) =
                   local_1b8.data._M_elems._32_8_;
              *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4) =
                   local_1b8.data._M_elems._16_8_;
              *(ulong *)((pnVar2->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar2->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_
              ;
              (pnVar2->m_backend).exp = local_1b8.exp;
              (pnVar2->m_backend).neg = local_1b8.neg;
              (pnVar2->m_backend).fpclass = local_1b8.fpclass;
              (pnVar2->m_backend).prec_elem = local_1b8.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_258,0,(type *)0x0);
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_1b8,&local_258);
              if (iVar10 != 0) goto LAB_002ac227;
              local_128.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_128.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.data._M_elems[1] = local_208.data._M_elems[1];
              uVar5 = local_128.data._M_elems._0_8_;
              local_128.data._M_elems[2] = local_208.data._M_elems[2];
              local_128.data._M_elems[3] = local_208.data._M_elems[3];
              local_128.data._M_elems[8] = local_208.data._M_elems[8];
              local_128.data._M_elems[9] = local_208.data._M_elems[9];
              local_128.data._M_elems[4] = local_208.data._M_elems[4];
              local_128.data._M_elems[5] = local_208.data._M_elems[5];
              local_128.exp = local_208.exp;
              local_128.neg = local_208.neg;
              local_128.fpclass = local_208.fpclass;
              local_128.prec_elem = local_208.prec_elem;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              if (local_128.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite) {
                local_128.neg = (bool)(local_208.neg ^ 1);
              }
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems._24_5_ = 0;
              local_258.data._M_elems[7]._1_3_ = 0;
              local_258.data._M_elems._32_5_ = 0;
              local_258.data._M_elems[9]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              pcVar16 = &local_128;
              if (&local_258 != pcVar14) {
                local_258.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_258.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_258.data._M_elems[4] = local_208.data._M_elems[4];
                local_258.data._M_elems[5] = local_208.data._M_elems[5];
                local_258.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_258.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_258.data._M_elems[0] = local_208.data._M_elems[0];
                local_258.data._M_elems[1] = local_208.data._M_elems[1];
                local_258.data._M_elems[2] = local_208.data._M_elems[2];
                local_258.data._M_elems[3] = local_208.data._M_elems[3];
                local_258.exp = local_208.exp;
                local_258.neg = local_128.neg;
                local_258.fpclass = local_208.fpclass;
                local_258.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar14;
              }
              local_128.data._M_elems._0_8_ = uVar5;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_258,pcVar16);
              local_1b8.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
              local_1b8.data._M_elems[4] = local_258.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_258.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_258.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_258.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_258.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_258.data._M_elems[3];
              local_1b8.exp = local_258.exp;
              local_1b8.neg = local_258.neg;
              local_1b8.prec_elem = local_258.prec_elem;
              local_1b8.fpclass = local_258.fpclass;
              auVar8 = (undefined1  [16])local_258.data._M_elems._0_16_;
              local_a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
              local_a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_a8.exp = (eps->m_backend).exp;
              local_a8.neg = (eps->m_backend).neg;
              local_a8.fpclass = (eps->m_backend).fpclass;
              local_a8.prec_elem = (eps->m_backend).prec_elem;
              if ((local_258.neg == true) &&
                 (local_258.data._M_elems[0] != 0 || local_258.fpclass != cpp_dec_float_finite)) {
                local_258.neg = false;
              }
              local_258.data._M_elems._0_16_ = auVar8;
              if ((local_a8.fpclass != cpp_dec_float_NaN && local_258.fpclass != cpp_dec_float_NaN)
                 && (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_258,&local_a8), 0 < iVar10)) {
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8) =
                     local_1b8.data._M_elems._32_8_;
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4) =
                     local_1b8.data._M_elems._16_8_;
                *(ulong *)((pnVar2->m_backend).data._M_elems + 6) =
                     CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
                *(undefined8 *)(pnVar2->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2) =
                     local_1b8.data._M_elems._8_8_;
                (pnVar2->m_backend).exp = local_1b8.exp;
                (pnVar2->m_backend).neg = local_1b8.neg;
                (pnVar2->m_backend).fpclass = local_1b8.fpclass;
                (pnVar2->m_backend).prec_elem = local_1b8.prec_elem;
                iVar11 = local_138[iVar11];
                uVar13 = local_20c;
                if (0 < (int)local_20c) {
                  do {
                    uVar1 = uVar13 - 1;
                    uVar7 = uVar1 >> 1;
                    if (iVar11 <= local_218[uVar7]) break;
                    local_218[uVar13] = local_218[uVar7];
                    uVar13 = uVar7;
                  } while (1 < uVar1);
                }
                local_20c = local_20c + 1;
                local_218[(int)uVar13] = iVar11;
              }
            }
            piVar15 = piVar15 + 1;
            pcVar14 = pcVar14 + 1;
            bVar6 = 1 < iVar9;
            iVar9 = iVar9 + -1;
          } while (bVar6);
        }
        local_1c8 = (ulong)((int)local_1c8 + 1);
        rn = local_20c;
        if ((double)(int)local_130 * 0.2 < (double)(int)local_20c) {
          if (-1 < (long)*local_218) {
            lVar18 = (long)*local_218;
            do {
              pcVar14 = &local_1c0[local_148[lVar18]].m_backend;
              pcVar12 = &(local_140->diag).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_148[lVar18]].m_backend;
              local_258.fpclass = cpp_dec_float_finite;
              local_258.prec_elem = 10;
              local_258.data._M_elems[0] = 0;
              local_258.data._M_elems[1] = 0;
              local_258.data._M_elems[2] = 0;
              local_258.data._M_elems[3] = 0;
              local_258.data._M_elems[4] = 0;
              local_258.data._M_elems[5] = 0;
              local_258.data._M_elems._24_5_ = 0;
              local_258.data._M_elems[7]._1_3_ = 0;
              local_258.data._M_elems._32_5_ = 0;
              local_258.data._M_elems[9]._1_3_ = 0;
              local_258.exp = 0;
              local_258.neg = false;
              pcVar16 = pcVar12;
              if ((&local_258 != pcVar14) && (pcVar16 = pcVar14, &local_258 != pcVar12)) {
                uVar5 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_258.data._M_elems._32_5_ = SUB85(uVar5,0);
                local_258.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_258.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
                local_258.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
                local_258.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_258.data._M_elems._24_5_ = SUB85(uVar5,0);
                local_258.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_258.exp = pcVar12->exp;
                local_258.neg = pcVar12->neg;
                local_258.fpclass = pcVar12->fpclass;
                local_258.prec_elem = pcVar12->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_258,pcVar16);
              local_208.data._M_elems[0] = local_258.data._M_elems[0];
              local_208.data._M_elems[1] = local_258.data._M_elems[1];
              local_208.data._M_elems[2] = local_258.data._M_elems[2];
              local_208.data._M_elems[3] = local_258.data._M_elems[3];
              local_208.data._M_elems[4] = local_258.data._M_elems[4];
              local_208.data._M_elems[5] = local_258.data._M_elems[5];
              local_208.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
              local_208.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
              local_208.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
              local_208.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
              local_208.exp = local_258.exp;
              local_208.neg = local_258.neg;
              local_208.fpclass = local_258.fpclass;
              local_208.prec_elem = local_258.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar14,0);
              local_258.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
              local_258.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
              local_258.data._M_elems[4] = local_208.data._M_elems[4];
              local_258.data._M_elems[5] = local_208.data._M_elems[5];
              local_258.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_258.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_258.data._M_elems[2] = local_208.data._M_elems[2];
              local_258.data._M_elems[3] = local_208.data._M_elems[3];
              local_258.data._M_elems[0] = local_208.data._M_elems[0];
              local_258.data._M_elems[1] = local_208.data._M_elems[1];
              auVar8 = (undefined1  [16])local_258.data._M_elems._0_16_;
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
              local_e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_e8.exp = (eps->m_backend).exp;
              local_e8.neg = (eps->m_backend).neg;
              local_e8.fpclass = (eps->m_backend).fpclass;
              local_e8.prec_elem = (eps->m_backend).prec_elem;
              local_258.exp = local_208.exp;
              local_258.neg = local_208.neg;
              local_258.fpclass = local_208.fpclass;
              local_258.prec_elem = local_208.prec_elem;
              if ((local_208.neg == true) &&
                 (local_258.data._M_elems[0] = local_208.data._M_elems[0],
                 local_258.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
                local_258.neg = false;
              }
              if ((local_e8.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN)
                 && (local_258.data._M_elems._0_16_ = auVar8,
                    iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_258,&local_e8), 0 < iVar9)) {
                iVar9 = local_160[lVar18];
                iVar11 = (int)local_1c8;
                local_1c8 = (ulong)(iVar11 + 1);
                local_150[iVar11] = iVar9;
                *(undefined8 *)(local_158[iVar9].m_backend.data._M_elems + 8) =
                     local_208.data._M_elems._32_8_;
                puVar3 = local_158[iVar9].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar3 = local_208.data._M_elems._16_8_;
                *(ulong *)(puVar3 + 2) =
                     CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
                *(undefined8 *)local_158[iVar9].m_backend.data._M_elems =
                     local_208.data._M_elems._0_8_;
                *(undefined8 *)(local_158[iVar9].m_backend.data._M_elems + 2) =
                     local_208.data._M_elems._8_8_;
                local_158[iVar9].m_backend.exp = local_208.exp;
                local_158[iVar9].m_backend.neg = local_208.neg;
                local_158[iVar9].m_backend.fpclass = local_208.fpclass;
                local_158[iVar9].m_backend.prec_elem = local_208.prec_elem;
                if (0 < local_168[iVar9]) {
                  piVar15 = local_170 + local_180[iVar9];
                  pcVar14 = &local_178[local_180[iVar9]].m_backend;
                  iVar9 = local_168[iVar9] + 1;
                  do {
                    local_258.fpclass = cpp_dec_float_finite;
                    local_258.prec_elem = 10;
                    local_258.data._M_elems[0] = 0;
                    local_258.data._M_elems[1] = 0;
                    local_258.data._M_elems[2] = 0;
                    local_258.data._M_elems[3] = 0;
                    local_258.data._M_elems[4] = 0;
                    local_258.data._M_elems[5] = 0;
                    local_258.data._M_elems._24_5_ = 0;
                    local_258.data._M_elems[7]._1_3_ = 0;
                    local_258.data._M_elems._32_5_ = 0;
                    local_258.data._M_elems[9]._1_3_ = 0;
                    local_258.exp = 0;
                    local_258.neg = false;
                    pcVar16 = &local_208;
                    if (pcVar14 != &local_258) {
                      local_258.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                      local_258.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                      local_258.data._M_elems[4] = local_208.data._M_elems[4];
                      local_258.data._M_elems[5] = local_208.data._M_elems[5];
                      local_258.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                      local_258.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                      local_258.data._M_elems[2] = local_208.data._M_elems[2];
                      local_258.data._M_elems[3] = local_208.data._M_elems[3];
                      local_258.data._M_elems[0] = local_208.data._M_elems[0];
                      local_258.data._M_elems[1] = local_208.data._M_elems[1];
                      local_258.exp = local_208.exp;
                      local_258.neg = local_208.neg;
                      local_258.fpclass = local_208.fpclass;
                      local_258.prec_elem = local_208.prec_elem;
                      pcVar16 = pcVar14;
                    }
                    pcVar14 = pcVar14 + 1;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                              (&local_258,pcVar16);
                    iVar11 = *piVar15;
                    piVar15 = piVar15 + 1;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_1c0[iVar11].m_backend,&local_258);
                    iVar9 = iVar9 + -1;
                  } while (1 < iVar9);
                }
              }
              bVar6 = 0 < lVar18;
              lVar18 = lVar18 + -1;
            } while (bVar6);
          }
          break;
        }
      }
    } while (0 < rn);
  }
  return (int)local_1c8;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}